

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

bool __thiscall QFileInfo::isRelative(QFileInfo *this)

{
  QFileInfoPrivate *pQVar1;
  _Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_> _Var2;
  undefined1 uVar3;
  bool bVar4;
  
  pQVar1 = (this->d_ptr).d.ptr;
  if ((pQVar1->field_0x1db & 0x40) != 0) {
    return true;
  }
  _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
       (pQVar1->fileEngine)._M_t.
       super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
       super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
       super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
  if (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl !=
      (QAbstractFileEngine *)0x0) {
    uVar3 = (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                  _M_head_impl + 0x98))
                      (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl);
    return (bool)uVar3;
  }
  bVar4 = QFileSystemEntry::isRelative(&pQVar1->fileEntry);
  return bVar4;
}

Assistant:

constexpr P get() const noexcept { return ptr; }